

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_session_init.c
# Opt level: O2

int deal_ws_request(int new_fd,sockaddr_in *client_addr,int shm_id,int i,int write_fd)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  ws_request *req;
  char *pcVar4;
  ssize_t sVar5;
  long lVar6;
  uint __i;
  long lVar7;
  ulong uVar8;
  timeval timeout;
  fd_set read_set;
  char recv_buf [1025];
  
  printf("%d");
  pvVar3 = shmat(shm_id,(void *)0x0,0);
  if (pvVar3 == (void *)0xffffffffffffffff) {
    pcVar4 = "Cannot link sharing memory to this process!(Game server)";
LAB_0010478e:
    puts(pcVar4);
LAB_00104793:
    iVar2 = -1;
  }
  else {
    lVar6 = (long)i * 0xec;
    iVar2 = *(int *)((long)pvVar3 + lVar6);
    memset(recv_buf,0,0x401);
    for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      read_set.__fds_bits[lVar7] = 0;
    }
    uVar8 = 1L << ((byte)new_fd & 0x3f);
    read_set.__fds_bits[new_fd / 0x40] = read_set.__fds_bits[new_fd / 0x40] | uVar8;
    timeout.tv_sec = 10;
    timeout.tv_usec = 0;
    req = (ws_request *)malloc(0x10f8);
    pcVar4 = inet_ntoa((in_addr)(client_addr->sin_addr).s_addr);
    strcpy(req->address,pcVar4);
    req->port = (uint)client_addr->sin_port;
    req->client_socket = new_fd;
    req->method_right_state = false;
    while (iVar1 = select(new_fd + 1,(fd_set *)&read_set,(fd_set *)0x0,(fd_set *)0x0,
                          (timeval *)&timeout), iVar1 != 0) {
      if (iVar1 == -1) {
        pcVar4 = "Cannot select read_fd!";
LAB_001047b1:
        perror(pcVar4);
        goto LAB_00104793;
      }
      if ((read_set.__fds_bits[new_fd / 0x40] & uVar8) != 0) {
        sVar5 = recv(new_fd,recv_buf,0x4000,0);
        if ((int)sVar5 == 0) {
          return 0;
        }
        if ((int)sVar5 < 0) {
          pcVar4 = "Read request failure!";
          goto LAB_001047b1;
        }
        printf("\n%s\n",recv_buf);
        iVar1 = is_ws_request(recv_buf,req);
        if (iVar1 == -1) {
          pcVar4 = "WebSocket request is illegal!";
          goto LAB_0010478e;
        }
        iVar1 = do_ws_response(req);
        if (iVar1 == -1) {
          pcVar4 = "Send WebSocket response failure!";
          goto LAB_0010478e;
        }
        analyGame(req->uri,(char *)((long)pvVar3 + lVar6 + 9),(int *)((long)pvVar3 + lVar6 + 0x1c));
        iVar2 = webSocket_session(new_fd,write_fd,iVar2,i);
        if (iVar2 == -1) {
          pcVar4 = "Pipe is broken";
          goto LAB_0010478e;
        }
        if (iVar2 == 1) {
          pcVar4 = "WebSocket session is close!";
          goto LAB_00104775;
        }
        pcVar4 = "Unknow error!";
        goto LAB_0010478e;
      }
      perror("FD set happen crash!");
    }
    pcVar4 = "Listen time out!";
LAB_00104775:
    puts(pcVar4);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int deal_ws_request(int new_fd, struct sockaddr_in *client_addr, int shm_id, int i, int write_fd){
    struct PIPE *pipes;
    printf("%d", shm_id);
    pipes = (struct PIPE *)shmat(shm_id, NULL, 0);
    if(pipes == -1){
        printf("Cannot link sharing memory to this process!(Game server)\n");
        return -1;
    }

    int read_fd = pipes[i].pipe[0];

    char recv_buf[HEAD_MAX_SIZE + 1] = "";
    char send_buf[HEAD_MAX_SIZE + 1] = "";

    int read_byte = 0;
    int file_byte = 0;


    fd_set read_set;
    FD_ZERO(&read_set);
    FD_SET(new_fd, &read_set);

    struct timeval timeout;
    timeout.tv_sec = TIME_OUT_SEC;
    timeout.tv_usec = TIME_OUT_USEC;

    struct ws_request *req
            = (struct ws_request *)malloc(sizeof(struct ws_request));
    strcpy(req->address, inet_ntoa(client_addr->sin_addr));
    req->port = client_addr->sin_port;
    req->client_socket = new_fd;
    req->method_right_state = false;

    int resel = 0;
    int maxfd = new_fd+1;

    while(true){
        resel = select(maxfd, &read_set, NULL, NULL, &timeout);
        switch (resel) {
            case -1:
                perror("Cannot select read_fd!");
                return -1;
            case 0:
                printf("Listen time out!\n");
                return 1;
            default:
                if(FD_ISSET(new_fd, &read_set)){
                    read_byte = (int)recv(new_fd, recv_buf, 16384, 0);
                    if(read_byte == 0){
                        return 0;     //connect interrupt!
                    } else if(read_byte < 0) {
                        perror("Read request failure!");
                        return -1;
                    } else {
                        printf("\n%s\n",recv_buf);
                        if(is_ws_request(recv_buf,req) == -1){
                            printf("WebSocket request is illegal!\n");
                            return -1;
                        }
                        if(do_ws_response(req) == -1){
                            printf("Send WebSocket response failure!\n");
                            return -1;
                        }
                        if(analyGame(req->uri, pipes[i].name, &(pipes[i].level))  == -1){
                            printf("Game name analysis error\n");
                            return -1;
                        }
                        switch (webSocket_session(new_fd, write_fd, read_fd, i)){
                            case 1:
                                printf("WebSocket session is close!\n");
                                return 1;
                            case -1:
                                printf("Pipe is broken\n");
                                return -1;
                            default:
                                printf("Unknow error!\n");
                                return -1;
                        }
                        return 1;
                    }
                } else {
                    perror("FD set happen crash!");
                    continue;
                }
        }
    }
}